

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall
re2::DFA::SearchParams::SearchParams
          (SearchParams *this,StringPiece *text,StringPiece *context,RWLocker *cache_lock)

{
  undefined4 uVar1;
  RWLocker *cache_lock_local;
  StringPiece *context_local;
  StringPiece *text_local;
  SearchParams *this_local;
  
  (this->text).ptr_ = text->ptr_;
  uVar1 = *(undefined4 *)&text->field_0xc;
  (this->text).length_ = text->length_;
  *(undefined4 *)&(this->text).field_0xc = uVar1;
  (this->context).ptr_ = context->ptr_;
  uVar1 = *(undefined4 *)&context->field_0xc;
  (this->context).length_ = context->length_;
  *(undefined4 *)&(this->context).field_0xc = uVar1;
  this->anchored = false;
  this->want_earliest_match = false;
  this->run_forward = false;
  this->start = (State *)0x0;
  this->firstbyte = -1;
  this->cache_lock = cache_lock;
  this->failed = false;
  this->ep = (char *)0x0;
  this->matches = (vector<int,_std::allocator<int>_> *)0x0;
  return;
}

Assistant:

SearchParams(const StringPiece& text, const StringPiece& context,
                 RWLocker* cache_lock)
      : text(text), context(context),
        anchored(false),
        want_earliest_match(false),
        run_forward(false),
        start(NULL),
        firstbyte(kFbUnknown),
        cache_lock(cache_lock),
        failed(false),
        ep(NULL),
        matches(NULL) { }